

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_traceback(lua_State *L,lua_State *L1,char *msg,int level)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  lua_Debug ar;
  
  iVar1 = lua_gettop(L);
  uVar5 = 1;
  uVar9 = 1;
  do {
    uVar8 = uVar9;
    uVar9 = uVar5;
    iVar2 = lua_getstack(L1,(int)uVar9,&ar);
    uVar5 = (ulong)(uint)((int)uVar9 * 2);
  } while (iVar2 != 0);
  while( true ) {
    uVar5 = uVar8;
    iVar2 = (int)uVar5;
    iVar3 = (int)uVar9;
    if (iVar3 <= iVar2) break;
    uVar8 = (long)(iVar3 + iVar2) / 2;
    iVar2 = (int)uVar8;
    iVar3 = lua_getstack(L1,iVar2,&ar);
    uVar7 = uVar8 & 0xffffffff;
    if (iVar3 != 0) {
      uVar7 = uVar9;
    }
    uVar8 = (ulong)(iVar2 + 1);
    uVar9 = uVar7;
    if (iVar3 == 0) {
      uVar8 = uVar5;
    }
  }
  if (msg != (char *)0x0) {
    lua_pushfstring(L,"%s\n");
  }
  uVar6 = -(uint)(-0x17 < level - iVar3) | 10;
  luaL_checkstack(L,10,(char *)0x0);
  lua_pushstring(L,"stack traceback:");
  do {
    while( true ) {
      iVar2 = lua_getstack(L1,level,&ar);
      if (iVar2 == 0) {
        iVar2 = lua_gettop(L);
        lua_concat(L,iVar2 - iVar1);
        return;
      }
      bVar10 = uVar6 != 0;
      uVar6 = uVar6 - 1;
      if (bVar10) break;
      lua_pushstring(L,"\n\t...");
      level = iVar3 + -0xb;
    }
    lua_getinfo(L1,"Slnt",&ar);
    lua_pushfstring(L,"\n\t%s:",ar.short_src);
    if (0 < ar.currentline) {
      lua_pushfstring(L,"%d:");
    }
    lua_pushstring(L," in ");
    iVar2 = pushglobalfuncname(L,&ar);
    if (iVar2 == 0) {
      if (*ar.namewhat == '\0') {
        if (*ar.what == 'C') {
          pcVar4 = "?";
        }
        else {
          if (*ar.what != 'm') {
            lua_pushfstring(L,"function <%s:%d>",ar.short_src,(ulong)(uint)ar.linedefined);
            goto LAB_0010ea61;
          }
          pcVar4 = "main chunk";
        }
        lua_pushstring(L,pcVar4);
      }
      else {
        lua_pushfstring(L,"%s \'%s\'",ar.namewhat,ar.name);
      }
    }
    else {
      pcVar4 = lua_tolstring(L,-1,(size_t *)0x0);
      lua_pushfstring(L,"function \'%s\'",pcVar4);
      lua_rotate(L,-2,-1);
      lua_settop(L,-2);
    }
LAB_0010ea61:
    if (ar.istailcall != '\0') {
      lua_pushstring(L,"\n\t(...tail calls...)");
    }
    level = level + 1;
    iVar2 = lua_gettop(L);
    lua_concat(L,iVar2 - iVar1);
  } while( true );
}

Assistant:

LUALIB_API void luaL_traceback (lua_State *L, lua_State *L1,
                                const char *msg, int level) {
  lua_Debug ar;
  int top = lua_gettop(L);
  int last = lastlevel(L1);
  int n1 = (last - level > LEVELS1 + LEVELS2) ? LEVELS1 : -1;
  if (msg)
    lua_pushfstring(L, "%s\n", msg);
  luaL_checkstack(L, 10, NULL);
  lua_pushliteral(L, "stack traceback:");
  while (lua_getstack(L1, level++, &ar)) {
    if (n1-- == 0) {  /* too many levels? */
      lua_pushliteral(L, "\n\t...");  /* add a '...' */
      level = last - LEVELS2 + 1;  /* and skip to last ones */
    }
    else {
      lua_getinfo(L1, "Slnt", &ar);
      lua_pushfstring(L, "\n\t%s:", ar.short_src);
      if (ar.currentline > 0)
        lua_pushfstring(L, "%d:", ar.currentline);
      lua_pushliteral(L, " in ");
      pushfuncname(L, &ar);
      if (ar.istailcall)
        lua_pushliteral(L, "\n\t(...tail calls...)");
      lua_concat(L, lua_gettop(L) - top);
    }
  }
  lua_concat(L, lua_gettop(L) - top);
}